

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_state_machine.hxx
# Opt level: O2

void __thiscall
echo_state_machine::create_snapshot(echo_state_machine *this,snapshot *s,handler_type *when_done)

{
  ostream *poVar1;
  ptr<std::exception> except;
  bool ret;
  shared_ptr<std::exception> local_48;
  __shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"create snapshot ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," term ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::mutex::lock(&this->last_snapshot_lock_);
  nuraft::snapshot::serialize((snapshot *)&local_48);
  nuraft::snapshot::deserialize
            ((snapshot *)&local_30,
             (buffer *)
             local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->last_snapshot_).
              super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->last_snapshot_lock_);
  local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30._M_ptr._0_1_ = 1;
  std::function<void_(bool_&,_std::shared_ptr<std::exception>_&)>::operator()
            (when_done,(bool *)&local_30,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void create_snapshot(snapshot& s,
                         async_result<bool>::handler_type& when_done)
    {
        std::cout << "create snapshot " << s.get_last_log_idx()
                  << " term " << s.get_last_log_term() << std::endl;
        // Clone snapshot from `s`.
        {   std::lock_guard<std::mutex> l(last_snapshot_lock_);
            ptr<buffer> snp_buf = s.serialize();
            last_snapshot_ = snapshot::deserialize(*snp_buf);
        }
        ptr<std::exception> except(nullptr);
        bool ret = true;
        when_done(ret, except);
    }